

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
boost::runtime::cla::parser::help
          (parser *this,ostream *ostr,parameters_store *parameters,cstring *param_name)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  type pbVar4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  _Base_ptr p_Var7;
  basic_param_ptr param;
  trie_ptr local_108;
  pointer local_f8;
  pointer local_f0;
  shared_ptr<boost::runtime::basic_param> local_e8;
  cstring local_d8;
  pointer local_c8;
  pointer local_c0;
  cstring local_b8;
  locate_result local_a8;
  
  if (param_name->m_end == param_name->m_begin) {
    poVar5 = std::operator<<(ostr,"Usage: ");
    pbVar6 = unit_test::operator<<(poVar5,&this->m_program_name);
    std::operator<<(pbVar6," [Boost.Test argument]... ");
    if ((this->m_end_of_param_indicator)._M_string_length != 0) {
      poVar5 = std::operator<<(ostr,(string *)&this->m_end_of_param_indicator);
      std::operator<<(poVar5," [custom test module argument]...");
    }
    std::operator<<(ostr,
                    "\n\nBoost.Test arguments correspond to parameters listed below. All parameters are optional. You can use specify parameter value either as a command line argument or as a value of corresponding environment variable. In case if argument for the same parameter is specified in both places, command line is taking precedence. Command line argument format supports parameter name guessing, so you can use any unambiguous prefix to identify a parameter."
                   );
    if ((this->m_end_of_param_indicator)._M_string_length != 0) {
      poVar5 = std::operator<<(ostr," All the arguments after the ");
      poVar5 = std::operator<<(poVar5,(string *)&this->m_end_of_param_indicator);
      std::operator<<(poVar5," are ignored by the Boost.Test.");
    }
    std::operator<<(ostr,"\n\nBoost.Test supports following parameters:\n");
    bVar1 = true;
    for (p_Var7 = (parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (bVar1 && ((_Rb_tree_header *)p_Var7 !=
                   &(parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header));
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      bVar1 = false;
      while (!bVar1) {
        local_a8.first.m_prefix._M_dataplus._M_p = (pointer)p_Var7[1]._M_left;
        local_a8.first.m_prefix._M_string_length = (size_type)p_Var7[1]._M_right;
        if ((_Base_ptr)local_a8.first.m_prefix._M_string_length != (_Base_ptr)0x0) {
          LOCK();
          *(int *)&((_Base_ptr)local_a8.first.m_prefix._M_string_length)->_M_parent =
               *(int *)&((_Base_ptr)local_a8.first.m_prefix._M_string_length)->_M_parent + 1;
          UNLOCK();
        }
        pbVar4 = shared_ptr<boost::runtime::basic_param>::operator->
                           ((shared_ptr<boost::runtime::basic_param> *)&local_a8);
        local_f8 = (this->m_negation_prefix)._M_dataplus._M_p;
        local_f0 = local_f8 + (this->m_negation_prefix)._M_string_length;
        (*pbVar4->_vptr_basic_param[5])(pbVar4,ostr,&local_f8);
        detail::shared_count::~shared_count
                  ((shared_count *)&local_a8.first.m_prefix._M_string_length);
        bVar1 = true;
      }
    }
    std::operator<<(ostr,
                    "\nUse --help=<parameter name> to display detailed help for specific parameter.\n"
                   );
  }
  else {
    pmVar2 = std::
             map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             ::operator[](&this->m_param_trie,(key_type *)help_prefix);
    local_108.px = pmVar2->px;
    local_108.pn.pi_ = (pmVar2->pn).pi_;
    if (local_108.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_108.pn.pi_)->use_count_ = (local_108.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_d8.m_begin = param_name->m_begin;
    local_d8.m_end = param_name->m_end;
    local_b8.m_begin = "";
    sVar3 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("");
    local_b8.m_end = "\t" + sVar3 + 1;
    locate_parameter(&local_a8,this,&local_108,&local_d8,&local_b8);
    local_e8.px = local_a8.second.px;
    local_e8.pn.pi_ = local_a8.second.pn.pi_;
    local_a8.second.px = (element_type *)0x0;
    local_a8.second.pn.pi_ = (sp_counted_base *)0x0;
    std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
    ~pair(&local_a8);
    detail::shared_count::~shared_count(&local_108.pn);
    pbVar4 = shared_ptr<boost::runtime::basic_param>::operator->(&local_e8);
    local_c8 = (this->m_negation_prefix)._M_dataplus._M_p;
    local_c0 = local_c8 + (this->m_negation_prefix)._M_string_length;
    (*pbVar4->_vptr_basic_param[6])(pbVar4,ostr);
    detail::shared_count::~shared_count(&local_e8.pn);
  }
  return;
}

Assistant:

void
    help( std::ostream& ostr, parameters_store const& parameters, cstring param_name )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->help( ostr, m_negation_prefix );
            return;
        }

        ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
        if( !m_end_of_param_indicator.empty() )
            ostr << m_end_of_param_indicator << " [custom test module argument]...";

        ostr << "\n\nBoost.Test arguments correspond to parameters listed below. "
                "All parameters are optional. You can use specify parameter value either "
                "as a command line argument or as a value of corresponding environment "
                "variable. In case if argument for the same parameter is specified in both "
                "places, command line is taking precedence. Command line argument format "
                "supports parameter name guessing, so you can use any unambiguous "
                "prefix to identify a parameter.";
        if( !m_end_of_param_indicator.empty() )
            ostr << " All the arguments after the " << m_end_of_param_indicator << " are ignored by the Boost.Test.";

        ostr << "\n\nBoost.Test supports following parameters:\n";

        BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, parameters.all() ) {
            basic_param_ptr param = v.second;

            param->usage( ostr, m_negation_prefix );
        }

        ostr << "\nUse --help=<parameter name> to display detailed help for specific parameter.\n";
    }